

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::
SparseMatrix<(iDynTree::MatrixStorageOrdering)1>
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *other)

{
  size_t sVar1;
  Triplets oldTriplets;
  _Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> local_38;
  
  VectorDynSize::VectorDynSize(&this->m_values);
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_allocatedSize = 0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = other->m_columns;
  this->m_rows = other->m_rows;
  this->m_columns = sVar1;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = VectorDynSize::size(&other->m_values);
  Triplets::reserve((Triplets *)&local_38,sVar1);
  Triplets::addSubMatrix<(iDynTree::MatrixStorageOrdering)1>((Triplets *)&local_38,0,0,other);
  setFromTriplets(this,(Triplets *)&local_38);
  std::_Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::~_Vector_base(&local_38)
  ;
  return;
}

Assistant:

SparseMatrix<iDynTree::RowMajor>::SparseMatrix(const SparseMatrix<iDynTree::ColumnMajor>& other)
    : m_allocatedSize(0)
    , m_rows(other.rows())
    , m_columns(other.columns())
    {
        iDynTree::Triplets oldTriplets;
        oldTriplets.reserve(other.numberOfNonZeros());
        oldTriplets.addSubMatrix(0, 0, other);

        setFromTriplets(oldTriplets);
    }